

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

int __thiscall
rest_rpc::rpc_client::connect(rpc_client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  undefined3 extraout_var;
  undefined3 extraout_var_00;
  undefined3 uVar2;
  undefined4 in_register_00000034;
  rpc_client *in_stack_00000020;
  rpc_client *in_stack_00000028;
  undefined1 local_1;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_register_00000034,__fd));
  if (bVar1) {
    local_1 = true;
    uVar2 = extraout_var;
  }
  else {
    if (((ulong)__addr & 1) != 0) {
      upgrade_to_ssl(this);
    }
    async_connect(in_stack_00000020);
    local_1 = wait_conn(in_stack_00000028,(size_t)in_stack_00000020);
    uVar2 = extraout_var_00;
  }
  return CONCAT31(uVar2,local_1);
}

Assistant:

bool connect(size_t timeout = 3, bool is_ssl = false) {
    if (has_connected_)
      return true;

    assert(port_ != 0);
    if (is_ssl) {
      upgrade_to_ssl();
    }
    async_connect();
    return wait_conn(timeout);
  }